

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O3

void xmlCtxtDumpDocument(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  _xmlNode *node;
  
  if (doc == (xmlDocPtr)0x0) {
    if (ctxt->check == 0) {
      fwrite("DOCUMENT == NULL !\n",0x13,1,(FILE *)ctxt->output);
      return;
    }
  }
  else {
    xmlCtxtDumpDocumentHead(ctxt,doc);
    if (((doc->type | XML_CDATA_SECTION_NODE) == XML_HTML_DOCUMENT_NODE) &&
       (node = doc->children, node != (_xmlNode *)0x0)) {
      ctxt->depth = ctxt->depth + 1;
      do {
        xmlCtxtDumpNode(ctxt,node);
        node = node->next;
      } while (node != (_xmlNode *)0x0);
      ctxt->depth = ctxt->depth + -1;
    }
  }
  return;
}

Assistant:

static void
xmlCtxtDumpDocument(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "DOCUMENT == NULL !\n");
        return;
    }
    xmlCtxtDumpDocumentHead(ctxt, doc);
    if (((doc->type == XML_DOCUMENT_NODE) ||
         (doc->type == XML_HTML_DOCUMENT_NODE))
        && (doc->children != NULL)) {
        ctxt->depth++;
        xmlCtxtDumpNodeList(ctxt, doc->children);
        ctxt->depth--;
    }
}